

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemView::mouseDoubleClickEvent(QAbstractItemView *this,QMouseEvent *event)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  undefined4 uVar9;
  ulong uVar10;
  QStyle *pQVar11;
  undefined8 uVar12;
  long in_FS_OFFSET;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 local_d8 [16];
  QPersistentModelIndex persistent;
  QMouseEvent me;
  undefined1 *local_68;
  undefined1 *puStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)(this + 8);
  local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  auVar15 = QEventPoint::position();
  dVar14 = (double)((ulong)auVar15._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar15._0_8_;
  bVar5 = 2147483647.0 < dVar14;
  if (dVar14 <= -2147483648.0) {
    dVar14 = -2147483648.0;
  }
  dVar13 = (double)((ulong)auVar15._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar15._8_8_;
  bVar6 = 2147483647.0 < dVar13;
  if (dVar13 <= -2147483648.0) {
    dVar13 = -2147483648.0;
  }
  _me = (undefined1 *)
        CONCAT44((int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar13),
                 (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar14))
  ;
  (**(code **)(*(long *)this + 0x1f0))(&local_68,this,(QModelIndex *)&me);
  if (((-1 < (int)local_68) && (-1 < (long)local_68)) && (local_58.ptr != (QAbstractItemModel *)0x0)
     ) {
    uVar10 = (**(code **)(**(long **)(lVar4 + 0x2f8) + 0x138))(*(long **)(lVar4 + 0x2f8),&local_68);
    if ((uVar10 & 0x20) != 0) {
      cVar7 = comparesEqual((QPersistentModelIndex *)(lVar4 + 0x380),(QModelIndex *)&local_68);
      if (cVar7 != '\0') {
        persistent.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::QPersistentModelIndex(&persistent,(QModelIndex *)&local_68);
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&me,&persistent);
        local_48._0_8_ = (void *)0x0;
        local_48._8_8_ = (QModelIndex *)&me;
        QMetaObject::activate((QObject *)this,&staticMetaObject,2,(void **)local_48);
        if (*(int *)(event + 0x40) == 1) {
          QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&me,&persistent);
          cVar7 = (**(code **)(*(long *)this + 0x2e0))(this,(QModelIndex *)&me,2,event);
          if (cVar7 == '\0') {
            pQVar11 = QWidget::style((QWidget *)this);
            iVar8 = (**(code **)(*(long *)pQVar11 + 0xf0))(pQVar11,0x3d,0,this,0);
            if (iVar8 == 0) {
              QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&me,&persistent);
              local_48._0_8_ = (void *)0x0;
              local_48._8_8_ = (QModelIndex *)&me;
              QMetaObject::activate((QObject *)this,&staticMetaObject,3,(void **)local_48);
            }
          }
        }
        *(undefined1 *)(lVar4 + 0x3a5) = 1;
        QPersistentModelIndex::~QPersistentModelIndex(&persistent);
        goto LAB_00533f06;
      }
    }
  }
  _me = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = QEventPoint::position();
  persistent.d = (QPersistentModelIndexData *)QEventPoint::scenePosition();
  local_d8 = QEventPoint::globalPosition();
  uVar1 = *(undefined4 *)(event + 0x20);
  uVar2 = *(undefined4 *)(event + 0x40);
  uVar3 = *(undefined4 *)(event + 0x44);
  uVar9 = QMouseEvent::source();
  uVar12 = QPointerEvent::pointingDevice();
  QMouseEvent::QMouseEvent(&me,2,local_48,&persistent,local_d8,uVar2,uVar3,uVar1,uVar9,uVar12);
  (**(code **)(*(long *)this + 0x98))(this,&me);
  QMouseEvent::~QMouseEvent(&me);
LAB_00533f06:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_D(QAbstractItemView);

    QModelIndex index = indexAt(event->position().toPoint());
    if (!index.isValid()
        || !d->isIndexEnabled(index)
        || (d->pressedIndex != index)) {
        QMouseEvent me(QEvent::MouseButtonPress,
                       event->position(), event->scenePosition(), event->globalPosition(),
                       event->button(), event->buttons(), event->modifiers(),
                       event->source(), event->pointingDevice());
        mousePressEvent(&me);
        return;
    }
    // signal handlers may change the model
    QPersistentModelIndex persistent = index;
    emit doubleClicked(persistent);
    if ((event->button() == Qt::LeftButton) && !edit(persistent, DoubleClicked, event)
        && !style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, this))
        emit activated(persistent);
    d->releaseFromDoubleClick = true;
}